

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void BasePort::AddHardwareVersion(unsigned_long hver)

{
  bool bVar1;
  unsigned_long local_10;
  unsigned_long hver_local;
  
  if (hver != 0) {
    local_10 = hver;
    bVar1 = HardwareVersionValid(hver);
    if (!bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&SupportedHardware,&local_10);
    }
  }
  return;
}

Assistant:

void BasePort::AddHardwareVersion(unsigned long hver)
{
    // Add if non-zero and not already on list
    if (hver && !HardwareVersionValid(hver))
        SupportedHardware.push_back(hver);
}